

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

Block * __thiscall
google::protobuf::internal::ArenaImpl::NewBlock(ArenaImpl *this,Block *last_block,size_t min_bytes)

{
  LogMessage *other;
  Block *pBVar1;
  ulong uVar2;
  ulong uVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (last_block == (Block *)0x0) {
    uVar3 = (this->options_).start_block_size;
  }
  else {
    uVar3 = last_block->size_ * 2;
    uVar2 = (this->options_).max_block_size;
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
  }
  if (0xffffffffffffffe7 < min_bytes) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/arena.cc"
               ,0x76);
    other = LogMessage::operator<<
                      (&local_60,
                       "CHECK failed: (min_bytes) <= (std::numeric_limits<size_t>::max() - kBlockHeaderSize): "
                      );
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  uVar2 = min_bytes + 0x18;
  if (min_bytes + 0x18 < uVar3) {
    uVar2 = uVar3;
  }
  pBVar1 = (Block *)(*(this->options_).block_alloc)(uVar2);
  pBVar1->next_ = last_block;
  pBVar1->pos_ = 0x18;
  pBVar1->size_ = uVar2;
  LOCK();
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + uVar2;
  UNLOCK();
  return pBVar1;
}

Assistant:

ArenaImpl::Block* ArenaImpl::NewBlock(Block* last_block, size_t min_bytes) {
  size_t size;
  if (last_block) {
    // Double the current block size, up to a limit.
    size = std::min(2 * last_block->size(), options_.max_block_size);
  } else {
    size = options_.start_block_size;
  }
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  GOOGLE_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() - kBlockHeaderSize);
  size = std::max(size, kBlockHeaderSize + min_bytes);

  void* mem = options_.block_alloc(size);
  Block* b = new (mem) Block(size, last_block);
  space_allocated_.fetch_add(size, std::memory_order_relaxed);
  return b;
}